

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O2

string * CLI::clean_name_string(string *name,string *keyChars)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  string sStack_38;
  
  lVar3 = ::std::__cxx11::string::find_first_of((string *)name,(ulong)keyChars);
  if ((lVar3 != -1) ||
     (((pcVar1 = (name->_M_dataplus)._M_p, *pcVar1 == '[' &&
       (pcVar1[name->_M_string_length - 1] == ']')) ||
      (lVar3 = ::std::__cxx11::string::find_first_of((char *)name,0x193975), lVar3 != -1)))) {
    lVar3 = ::std::__cxx11::string::find((char)name,0x27);
    if ((lVar3 != -1) && (bVar2 = detail::has_escapable_character(name), bVar2)) {
      detail::add_escaped_characters(&sStack_38,name);
      ::std::__cxx11::string::operator=((string *)name,(string *)&sStack_38);
      ::std::__cxx11::string::~string((string *)&sStack_38);
    }
    ::std::__cxx11::string::insert((ulong)name,0,'\x01');
    ::std::__cxx11::string::push_back((char)name);
  }
  return name;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}